

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86::forward(Convolution1D_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  size_t sVar11;
  void *pvVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int *piVar20;
  void *pvVar21;
  byte bVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  float *pfVar32;
  float *pfVar33;
  void *pvVar34;
  void *pvVar35;
  long lVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  long lVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  long lVar47;
  undefined4 *puVar48;
  int iVar49;
  int iVar50;
  long lVar51;
  float *pfVar52;
  long lVar53;
  long lVar54;
  undefined1 (*pauVar55) [16];
  long lVar56;
  long lVar57;
  bool bVar58;
  undefined1 extraout_var [12];
  undefined1 auVar59 [16];
  undefined1 extraout_var_00 [12];
  undefined1 auVar60 [16];
  float fVar61;
  float fVar62;
  float fVar63;
  v4sf one;
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar78 [12];
  undefined8 uVar77;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar88;
  float fVar91;
  float fVar92;
  float fVar93;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  int inh;
  int elempack;
  ulong local_1e0;
  ulong local_1d8;
  void *local_1b8;
  ulong local_1b0;
  void *local_1a8;
  long local_180;
  long local_160;
  Mat local_108;
  ulong local_b8;
  ulong local_b0;
  undefined8 local_a8;
  void *local_a0;
  ulong local_98;
  ulong local_90;
  undefined1 local_88 [16];
  ulong local_70;
  long local_68;
  long local_60;
  long local_58;
  void *local_50;
  long local_48;
  void *local_40;
  ulong local_38;
  
  uVar31 = bottom_blob->elemsize;
  iVar7 = (this->super_Convolution1D).kernel_w;
  iVar8 = (this->super_Convolution1D).dilation_w;
  iVar9 = bottom_blob->elempack;
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize._0_4_ = 0;
  local_108.elemsize._4_4_ = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  Convolution1D::make_padding(&this->super_Convolution1D,bottom_blob,&local_108,opt);
  iVar43 = -100;
  if ((local_108.data != (void *)0x0) && ((long)local_108.c * local_108.cstep != 0)) {
    uVar27 = (this->super_Convolution1D).num_output;
    bVar22 = (uVar27 & 3) == 0 & opt->use_packing_layout;
    iVar49 = (uint)bVar22 + (uint)bVar22 * 2 + 1;
    Mat::create(top_blob,(~((iVar7 + -1) * iVar8) + local_108.w) /
                         (this->super_Convolution1D).stride_w + 1,(int)uVar27 / iVar49,
                uVar31 / (ulong)(long)iVar9 << bVar22 * '\x02',iVar49,opt->blob_allocator);
    iVar7 = local_108.elempack;
    auVar73 = _DAT_005e2f60;
    auVar79 = _DAT_005e2f50;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar8 = (this->super_Convolution1D).kernel_w;
      uVar27 = (this->super_Convolution1D).activation_type;
      local_90 = (ulong)uVar27;
      iVar9 = (this->super_Convolution1D).dilation_w;
      lVar51 = (long)iVar9;
      iVar43 = (this->super_Convolution1D).stride_w;
      lVar28 = (long)iVar43;
      uVar23 = local_108.h * local_108.elempack;
      iVar24 = local_108.w * local_108.elempack;
      local_98 = (ulong)(uint)top_blob->w;
      local_b8 = (long)top_blob->h * (long)top_blob->elempack;
      iVar49 = (int)local_b8;
      iVar50 = iVar49 + 3;
      if (-1 < iVar49) {
        iVar50 = iVar49;
      }
      pvVar10 = (this->super_Convolution1D).bias_data.data;
      uVar44 = iVar50 >> 2;
      lVar40 = (long)iVar24;
      if (3 < iVar49) {
        lVar47 = (long)top_blob->elempack * (long)top_blob->w;
        iVar50 = (int)lVar47;
        lVar29 = (long)(iVar50 * 2);
        local_88._0_8_ = lVar29;
        local_1e0 = 0;
        fVar94 = (float)DAT_005e2f50;
        fVar95 = DAT_005e2f50._4_4_;
        fVar96 = DAT_005e2f50._8_4_;
        fVar97 = DAT_005e2f50._12_4_;
        fVar61 = (float)DAT_005e2f60;
        fVar62 = DAT_005e2f60._4_4_;
        fVar63 = DAT_005e2f60._8_4_;
        fVar64 = DAT_005e2f60._12_4_;
        do {
          lVar30 = (long)top_blob->w;
          if (0 < lVar30) {
            uVar46 = local_108.h * local_108.elempack;
            iVar26 = top_blob->elempack;
            pauVar55 = (undefined1 (*) [16])
                       ((int)((long)((ulong)(uint)((int)(local_1e0 * 4) >> 0x1f) << 0x20 |
                                    local_1e0 * 4 & 0xffffffff) / (long)iVar26) * lVar30 *
                        top_blob->elemsize + (long)top_blob->data);
            local_180 = 0;
            iVar45 = 0;
            lVar54 = 0;
            local_1b8 = (void *)(lVar40 * 4);
            do {
              fVar102 = 0.0;
              fVar103 = 0.0;
              fVar104 = 0.0;
              fVar105 = 0.0;
              fVar88 = 0.0;
              fVar91 = 0.0;
              fVar92 = 0.0;
              fVar93 = 0.0;
              if (pvVar10 != (void *)0x0) {
                pfVar52 = (float *)((long)pvVar10 + local_1e0 * 0x10);
                fVar88 = *pfVar52;
                fVar91 = pfVar52[1];
                fVar92 = pfVar52[2];
                fVar93 = pfVar52[3];
              }
              pfVar52 = (float *)((this->weight_data_tm).cstep * local_1e0 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              uVar31 = 0;
              if ((int)uVar46 < 4) {
                fVar82 = 0.0;
                fVar85 = 0.0;
                fVar86 = 0.0;
                fVar87 = 0.0;
                fVar98 = 0.0;
                fVar99 = 0.0;
                fVar100 = 0.0;
                fVar101 = 0.0;
              }
              else {
                fVar98 = 0.0;
                fVar99 = 0.0;
                fVar100 = 0.0;
                fVar101 = 0.0;
                fVar82 = 0.0;
                fVar85 = 0.0;
                fVar86 = 0.0;
                fVar87 = 0.0;
                iVar42 = 0;
                do {
                  lVar36 = (long)(iVar42 / local_108.elempack) *
                           (long)local_108.w *
                           CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
                  pfVar37 = (float *)((long)local_108.data +
                                     lVar36 + (long)(iVar43 * local_108.elempack * (int)lVar54) * 4)
                  ;
                  if ((local_108.elempack == 4) && (0 < iVar8)) {
                    pfVar37 = (float *)((long)local_108.data + lVar36 + (long)iVar45 * 4);
                    iVar41 = iVar8;
                    do {
                      fVar1 = *pfVar37;
                      fVar2 = pfVar37[1];
                      fVar3 = pfVar37[2];
                      fVar4 = pfVar37[3];
                      fVar88 = fVar88 + fVar1 * *pfVar52;
                      fVar91 = fVar91 + fVar1 * pfVar52[1];
                      fVar92 = fVar92 + fVar1 * pfVar52[2];
                      fVar93 = fVar93 + fVar1 * pfVar52[3];
                      fVar98 = fVar98 + fVar2 * pfVar52[4];
                      fVar99 = fVar99 + fVar2 * pfVar52[5];
                      fVar100 = fVar100 + fVar2 * pfVar52[6];
                      fVar101 = fVar101 + fVar2 * pfVar52[7];
                      fVar82 = fVar82 + fVar3 * pfVar52[8];
                      fVar85 = fVar85 + fVar3 * pfVar52[9];
                      fVar86 = fVar86 + fVar3 * pfVar52[10];
                      fVar87 = fVar87 + fVar3 * pfVar52[0xb];
                      fVar102 = fVar102 + fVar4 * pfVar52[0xc];
                      fVar103 = fVar103 + fVar4 * pfVar52[0xd];
                      fVar104 = fVar104 + fVar4 * pfVar52[0xe];
                      fVar105 = fVar105 + fVar4 * pfVar52[0xf];
                      pfVar52 = pfVar52 + 0x10;
                      pfVar37 = pfVar37 + iVar9 * 4;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  if ((local_108.elempack == 1) && (iVar41 = iVar8, 0 < iVar8)) {
                    do {
                      fVar1 = *pfVar37;
                      fVar88 = fVar88 + fVar1 * *pfVar52;
                      fVar91 = fVar91 + fVar1 * pfVar52[1];
                      fVar92 = fVar92 + fVar1 * pfVar52[2];
                      fVar93 = fVar93 + fVar1 * pfVar52[3];
                      fVar1 = pfVar37[lVar40];
                      fVar98 = fVar98 + fVar1 * pfVar52[4];
                      fVar99 = fVar99 + fVar1 * pfVar52[5];
                      fVar100 = fVar100 + fVar1 * pfVar52[6];
                      fVar101 = fVar101 + fVar1 * pfVar52[7];
                      fVar1 = pfVar37[iVar24 * 2];
                      fVar82 = fVar82 + fVar1 * pfVar52[8];
                      fVar85 = fVar85 + fVar1 * pfVar52[9];
                      fVar86 = fVar86 + fVar1 * pfVar52[10];
                      fVar87 = fVar87 + fVar1 * pfVar52[0xb];
                      fVar1 = pfVar37[iVar24 * 3];
                      fVar102 = fVar102 + fVar1 * pfVar52[0xc];
                      fVar103 = fVar103 + fVar1 * pfVar52[0xd];
                      fVar104 = fVar104 + fVar1 * pfVar52[0xe];
                      fVar105 = fVar105 + fVar1 * pfVar52[0xf];
                      pfVar52 = pfVar52 + 0x10;
                      pfVar37 = pfVar37 + lVar51;
                      iVar41 = iVar41 + -1;
                    } while (iVar41 != 0);
                  }
                  iVar41 = iVar42 + 7;
                  iVar42 = iVar42 + 4;
                } while (iVar41 < (int)uVar46);
                uVar31 = (ulong)uVar46 & 0xfffffffc;
              }
              uVar25 = (uint)uVar31;
              if ((int)(uVar25 | 1) < (int)uVar46) {
                lVar36 = (long)local_108.w *
                         CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
                lVar56 = lVar36 * uVar31;
                lVar53 = (long)local_108.data + lVar56 + (long)local_1b8;
                lVar36 = lVar36 * 2;
                lVar56 = (long)local_108.data + lVar56 + local_180;
                do {
                  if (0 < iVar8) {
                    lVar57 = 0;
                    iVar42 = iVar8;
                    do {
                      fVar1 = *(float *)(lVar56 + lVar57);
                      fVar88 = fVar88 + fVar1 * *pfVar52;
                      fVar91 = fVar91 + fVar1 * pfVar52[1];
                      fVar92 = fVar92 + fVar1 * pfVar52[2];
                      fVar93 = fVar93 + fVar1 * pfVar52[3];
                      fVar1 = *(float *)(lVar53 + lVar57);
                      fVar98 = fVar98 + fVar1 * pfVar52[4];
                      fVar99 = fVar99 + fVar1 * pfVar52[5];
                      fVar100 = fVar100 + fVar1 * pfVar52[6];
                      fVar101 = fVar101 + fVar1 * pfVar52[7];
                      pfVar52 = pfVar52 + 8;
                      lVar57 = lVar57 + lVar51 * 4;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  uVar31 = uVar31 + 2;
                  uVar25 = (uint)uVar31;
                  lVar53 = lVar53 + lVar36;
                  lVar56 = lVar56 + lVar36;
                } while ((int)(uVar25 | 1) < (int)uVar46);
              }
              if ((int)uVar25 < (int)uVar46) {
                lVar36 = (long)local_108.w *
                         CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
                uVar31 = (ulong)uVar25;
                pfVar37 = (float *)(lVar36 * uVar31 + local_180 + (long)local_108.data);
                do {
                  pfVar32 = pfVar37;
                  iVar42 = iVar8;
                  if (0 < iVar8) {
                    do {
                      fVar1 = *pfVar32;
                      fVar88 = fVar88 + fVar1 * *pfVar52;
                      fVar91 = fVar91 + fVar1 * pfVar52[1];
                      fVar92 = fVar92 + fVar1 * pfVar52[2];
                      fVar93 = fVar93 + fVar1 * pfVar52[3];
                      pfVar52 = pfVar52 + 4;
                      pfVar32 = pfVar32 + lVar51;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  uVar31 = uVar31 + 1;
                  pfVar37 = (float *)((long)pfVar37 + lVar36);
                } while ((int)uVar31 < (int)uVar46);
              }
              fVar88 = fVar82 + fVar102 + fVar98 + fVar88;
              fVar91 = fVar85 + fVar103 + fVar99 + fVar91;
              auVar84._0_8_ = CONCAT44(fVar91,fVar88);
              auVar84._8_4_ = fVar86 + fVar104 + fVar100 + fVar92;
              auVar84._12_4_ = fVar87 + fVar105 + fVar101 + fVar93;
              switch(uVar27) {
              case 1:
                auVar84 = maxps(auVar84,ZEXT816(0));
                break;
              case 2:
                auVar68._8_4_ = auVar84._8_4_;
                auVar68._0_8_ = auVar84._0_8_;
                auVar68._12_4_ = auVar84._12_4_;
                auVar69 = maxps(auVar68,ZEXT816(0));
                auVar70 = minps(auVar84,ZEXT816(0));
                fVar88 = *(this->super_Convolution1D).activation_params.data;
                auVar84._4_4_ = fVar88 * auVar70._4_4_ + auVar69._4_4_;
                auVar84._0_4_ = fVar88 * auVar70._0_4_ + auVar69._0_4_;
                auVar84._8_4_ = fVar88 * auVar70._8_4_ + auVar69._8_4_;
                auVar84._12_4_ = fVar88 * auVar70._12_4_ + auVar69._12_4_;
                break;
              case 3:
                puVar48 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar5 = *puVar48;
                uVar6 = puVar48[1];
                auVar67._4_4_ = uVar5;
                auVar67._0_4_ = uVar5;
                auVar67._8_4_ = uVar5;
                auVar67._12_4_ = uVar5;
                auVar84 = maxps(auVar84,auVar67);
                auVar16._4_4_ = uVar6;
                auVar16._0_4_ = uVar6;
                auVar16._8_4_ = uVar6;
                auVar16._12_4_ = uVar6;
                auVar84 = minps(auVar84,auVar16);
                break;
              case 4:
                auVar83._0_8_ = CONCAT44(fVar91,fVar88) ^ 0x8000000080000000;
                auVar83._8_4_ = -auVar84._8_4_;
                auVar83._12_4_ = -auVar84._12_4_;
                auVar84 = minps(auVar83,_DAT_005e2f20);
                auVar84 = maxps(auVar84,_DAT_005e2f30);
                fVar91 = auVar84._0_4_ * 1.442695 + fVar94;
                fVar93 = auVar84._4_4_ * 1.442695 + fVar95;
                fVar103 = auVar84._8_4_ * 1.442695 + fVar96;
                fVar105 = auVar84._12_4_ * 1.442695 + fVar97;
                fVar88 = (float)(int)fVar91;
                fVar92 = (float)(int)fVar93;
                fVar102 = (float)(int)fVar103;
                fVar104 = (float)(int)fVar105;
                fVar88 = fVar88 - (float)(-(uint)(fVar91 < fVar88) & (uint)fVar61);
                fVar92 = fVar92 - (float)(-(uint)(fVar93 < fVar92) & (uint)fVar62);
                fVar102 = fVar102 - (float)(-(uint)(fVar103 < fVar102) & (uint)fVar63);
                fVar104 = fVar104 - (float)(-(uint)(fVar105 < fVar104) & (uint)fVar64);
                fVar91 = fVar88 * -0.6931472 + auVar84._0_4_;
                fVar93 = fVar92 * -0.6931472 + auVar84._4_4_;
                fVar103 = fVar102 * -0.6931472 + auVar84._8_4_;
                fVar105 = fVar104 * -0.6931472 + auVar84._12_4_;
                auVar15._4_4_ =
                     (float)((int)fVar92 * 0x800000 + (int)fVar62) *
                     (fVar93 + fVar62 +
                     (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                       0.041665796) * fVar93 + 0.16666666) * fVar93 + fVar95) * fVar93 * fVar93) +
                     fVar62;
                auVar15._0_4_ =
                     (float)((int)fVar88 * 0x800000 + (int)fVar61) *
                     (fVar91 + fVar61 +
                     (((((fVar91 * 0.00019875691 + 0.0013981999) * fVar91 + 0.008333452) * fVar91 +
                       0.041665796) * fVar91 + 0.16666666) * fVar91 + fVar94) * fVar91 * fVar91) +
                     fVar61;
                auVar15._8_4_ =
                     (float)((int)fVar102 * 0x800000 + (int)fVar63) *
                     (fVar103 + fVar63 +
                     (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103
                       + 0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar96) *
                     fVar103 * fVar103) + fVar63;
                auVar15._12_4_ =
                     (float)((int)fVar104 * 0x800000 + (int)fVar64) *
                     (fVar105 + fVar64 +
                     (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) * fVar105
                       + 0.041665796) * fVar105 + 0.16666666) * fVar105 + fVar97) *
                     fVar105 * fVar105) + fVar64;
                auVar84 = divps(auVar73,auVar15);
                break;
              case 5:
                auVar65._8_4_ = auVar84._8_4_;
                auVar65._0_8_ = auVar84._0_8_;
                auVar65._12_4_ = auVar84._12_4_;
                auVar69 = minps(auVar65,_DAT_005e2f20);
                auVar69 = maxps(auVar69,_DAT_005e2f30);
                fVar92 = auVar69._0_4_ * 1.442695 + fVar94;
                fVar93 = auVar69._4_4_ * 1.442695 + fVar95;
                fVar102 = auVar69._8_4_ * 1.442695 + fVar96;
                fVar103 = auVar69._12_4_ * 1.442695 + fVar97;
                fVar104 = (float)(int)fVar92;
                fVar105 = (float)(int)fVar93;
                fVar82 = (float)(int)fVar102;
                fVar85 = (float)(int)fVar103;
                fVar104 = fVar104 - (float)(-(uint)(fVar92 < fVar104) & (uint)fVar61);
                fVar105 = fVar105 - (float)(-(uint)(fVar93 < fVar105) & (uint)fVar62);
                fVar82 = fVar82 - (float)(-(uint)(fVar102 < fVar82) & (uint)fVar63);
                fVar85 = fVar85 - (float)(-(uint)(fVar103 < fVar85) & (uint)fVar64);
                fVar92 = auVar69._0_4_ - fVar104 * 0.6931472;
                fVar93 = auVar69._4_4_ - fVar105 * 0.6931472;
                fVar102 = auVar69._8_4_ - fVar82 * 0.6931472;
                fVar103 = auVar69._12_4_ - fVar85 * 0.6931472;
                auVar89._0_4_ =
                     (float)((int)fVar104 * 0x800000 + (int)fVar61) *
                     (fVar92 + fVar61 +
                     (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                       0.041665796) * fVar92 + 0.16666666) * fVar92 + fVar94) * fVar92 * fVar92) +
                     fVar61;
                auVar89._4_4_ =
                     (float)((int)fVar105 * 0x800000 + (int)fVar62) *
                     (fVar93 + fVar62 +
                     (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                       0.041665796) * fVar93 + 0.16666666) * fVar93 + fVar95) * fVar93 * fVar93) +
                     fVar62;
                auVar89._8_4_ =
                     (float)((int)fVar82 * 0x800000 + (int)fVar63) *
                     (fVar102 + fVar63 +
                     (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102
                       + 0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar96) *
                     fVar102 * fVar102) + fVar63;
                auVar89._12_4_ =
                     (float)((int)fVar85 * 0x800000 + (int)fVar64) *
                     (fVar103 + fVar64 +
                     (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103
                       + 0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar97) *
                     fVar103 * fVar103) + fVar64;
                auVar69 = maxps(auVar89,_DAT_005e2fd0);
                auVar90._0_8_ = auVar69._0_8_ & 0x807fffff807fffff;
                auVar90._8_4_ = auVar69._8_4_ & 0x807fffff;
                auVar90._12_4_ = auVar69._12_4_ & 0x807fffff;
                auVar90 = auVar90 | auVar79;
                fVar92 = auVar90._0_4_;
                fVar102 = auVar90._4_4_;
                fVar104 = auVar90._8_4_;
                fVar82 = auVar90._12_4_;
                fVar93 = fVar92 + (float)DAT_005e3010 +
                         (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar92);
                fVar103 = fVar102 + DAT_005e3010._4_4_ +
                          (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar102);
                fVar105 = fVar104 + DAT_005e3010._8_4_ +
                          (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar104);
                fVar85 = fVar82 + DAT_005e3010._12_4_ +
                         (float)(-(uint)(fVar82 < 0.70710677) & (uint)fVar82);
                auVar66._0_8_ =
                     CONCAT44(-(uint)(auVar89._4_4_ <= 0.0),-(uint)(auVar89._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar66._8_4_ = -(uint)(auVar89._8_4_ <= 0.0) & 0x7fffffff;
                auVar66._12_4_ = -(uint)(auVar89._12_4_ <= 0.0) & 0x7fffffff;
                auVar13._4_4_ =
                     ~-(uint)(auVar89._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar102 < 0.70710677) & (uint)fVar62)) * 0.6931472 +
                             fVar103 +
                            (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984) *
                                   fVar103 + -0.12420141) * fVar103 + 0.14249323) * fVar103 +
                                -0.16668057) * fVar103 + 0.20000714) * fVar103 + -0.24999994) *
                              fVar103 + 0.3333333) * fVar103 + -0.5) * fVar103 * fVar103) * -2.0);
                auVar13._0_4_ =
                     ~-(uint)(auVar89._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar92 < 0.70710677) & (uint)fVar61)) * 0.6931472 +
                             fVar93 + (((((((((fVar93 * 0.070376836 + -0.1151461) * fVar93 +
                                             0.116769984) * fVar93 + -0.12420141) * fVar93 +
                                           0.14249323) * fVar93 + -0.16668057) * fVar93 + 0.20000714
                                         ) * fVar93 + -0.24999994) * fVar93 + 0.3333333) * fVar93 +
                                      -0.5) * fVar93 * fVar93) * -2.0);
                auVar13._8_4_ =
                     ~-(uint)(auVar89._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar104 < 0.70710677) & (uint)fVar63)) * 0.6931472 +
                             fVar105 +
                            (((((((((fVar105 * 0.070376836 + -0.1151461) * fVar105 + 0.116769984) *
                                   fVar105 + -0.12420141) * fVar105 + 0.14249323) * fVar105 +
                                -0.16668057) * fVar105 + 0.20000714) * fVar105 + -0.24999994) *
                              fVar105 + 0.3333333) * fVar105 + -0.5) * fVar105 * fVar105) * -2.0);
                auVar13._12_4_ =
                     ~-(uint)(auVar89._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar69._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar82 < 0.70710677) & (uint)fVar64)) * 0.6931472 +
                             fVar85 + (((((((((fVar85 * 0.070376836 + -0.1151461) * fVar85 +
                                             0.116769984) * fVar85 + -0.12420141) * fVar85 +
                                           0.14249323) * fVar85 + -0.16668057) * fVar85 + 0.20000714
                                         ) * fVar85 + -0.24999994) * fVar85 + 0.3333333) * fVar85 +
                                      -0.5) * fVar85 * fVar85) * -2.0);
                auVar69 = minps(auVar66 | auVar13,_DAT_005e2f20);
                auVar69 = maxps(auVar69,_DAT_005e2f30);
                fVar92 = auVar69._0_4_ * 1.442695 + fVar94;
                fVar93 = auVar69._4_4_ * 1.442695 + fVar95;
                fVar102 = auVar69._8_4_ * 1.442695 + fVar96;
                fVar103 = auVar69._12_4_ * 1.442695 + fVar97;
                fVar104 = (float)(int)fVar92;
                fVar105 = (float)(int)fVar93;
                fVar82 = (float)(int)fVar102;
                fVar85 = (float)(int)fVar103;
                fVar104 = fVar104 - (float)(-(uint)(fVar92 < fVar104) & (uint)fVar61);
                fVar105 = fVar105 - (float)(-(uint)(fVar93 < fVar105) & (uint)fVar62);
                fVar82 = fVar82 - (float)(-(uint)(fVar102 < fVar82) & (uint)fVar63);
                fVar85 = fVar85 - (float)(-(uint)(fVar103 < fVar85) & (uint)fVar64);
                fVar92 = auVar69._0_4_ - fVar104 * 0.6931472;
                fVar93 = auVar69._4_4_ - fVar105 * 0.6931472;
                fVar102 = auVar69._8_4_ - fVar82 * 0.6931472;
                fVar103 = auVar69._12_4_ - fVar85 * 0.6931472;
                auVar14._4_4_ =
                     (float)((int)fVar105 * 0x800000 + (int)fVar62) *
                     (fVar93 + fVar62 +
                     (((((fVar93 * 0.00019875691 + 0.0013981999) * fVar93 + 0.008333452) * fVar93 +
                       0.041665796) * fVar93 + 0.16666666) * fVar93 + fVar95) * fVar93 * fVar93) +
                     fVar62;
                auVar14._0_4_ =
                     (float)((int)fVar104 * 0x800000 + (int)fVar61) *
                     (fVar92 + fVar61 +
                     (((((fVar92 * 0.00019875691 + 0.0013981999) * fVar92 + 0.008333452) * fVar92 +
                       0.041665796) * fVar92 + 0.16666666) * fVar92 + fVar94) * fVar92 * fVar92) +
                     fVar61;
                auVar14._8_4_ =
                     (float)((int)fVar82 * 0x800000 + (int)fVar63) *
                     (fVar102 + fVar63 +
                     (((((fVar102 * 0.00019875691 + 0.0013981999) * fVar102 + 0.008333452) * fVar102
                       + 0.041665796) * fVar102 + 0.16666666) * fVar102 + fVar96) *
                     fVar102 * fVar102) + fVar63;
                auVar14._12_4_ =
                     (float)((int)fVar85 * 0x800000 + (int)fVar64) *
                     (fVar103 + fVar64 +
                     (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) * fVar103
                       + 0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar97) *
                     fVar103 * fVar103) + fVar64;
                auVar69 = divps(_DAT_005e3bf0,auVar14);
                auVar70._0_4_ = auVar69._0_4_ + (float)DAT_005e3010;
                auVar70._4_4_ = auVar69._4_4_ + DAT_005e3010._4_4_;
                auVar70._8_4_ = auVar69._8_4_ + DAT_005e3010._8_4_;
                auVar70._12_4_ = auVar69._12_4_ + DAT_005e3010._12_4_;
                goto LAB_00562ffc;
              case 6:
                pfVar52 = (float *)(this->super_Convolution1D).activation_params.data;
                fVar92 = *pfVar52;
                fVar93 = pfVar52[1];
                auVar69._0_4_ = fVar92 * fVar88 + fVar93;
                auVar69._4_4_ = fVar92 * fVar91 + fVar93;
                auVar69._8_4_ = fVar92 * auVar84._8_4_ + fVar93;
                auVar69._12_4_ = fVar92 * auVar84._12_4_ + fVar93;
                auVar69 = maxps(auVar69,ZEXT816(0));
                auVar70 = minps(auVar69,auVar73);
LAB_00562ffc:
                auVar84._0_4_ = fVar88 * auVar70._0_4_;
                auVar84._4_4_ = fVar91 * auVar70._4_4_;
                auVar84._8_4_ = auVar84._8_4_ * auVar70._8_4_;
                auVar84._12_4_ = auVar84._12_4_ * auVar70._12_4_;
              }
              if (iVar26 == 4) {
                *pauVar55 = auVar84;
                pauVar55 = pauVar55 + 1;
              }
              if (iVar26 == 1) {
                *(int *)*pauVar55 = auVar84._0_4_;
                *(int *)((long)*pauVar55 + lVar47 * 4) = auVar84._4_4_;
                *(int *)((long)*pauVar55 + lVar29 * 4) = auVar84._8_4_;
                *(int *)((long)*pauVar55 + (long)(iVar50 * 3) * 4) = auVar84._12_4_;
                pauVar55 = (undefined1 (*) [16])((long)*pauVar55 + 4);
              }
              lVar54 = lVar54 + 1;
              iVar45 = iVar45 + iVar43 * local_108.elempack;
              local_1b8 = (void *)((long)local_1b8 + lVar28 * 4);
              local_180 = local_180 + lVar28 * 4;
            } while (lVar54 != lVar30);
          }
          local_1e0 = local_1e0 + 1;
        } while (local_1e0 != uVar44);
      }
      iVar49 = iVar49 + uVar44 * -4;
      local_70 = (ulong)(uint)(iVar49 / 2);
      if (1 < iVar49) {
        iVar50 = local_108.h * local_108.elempack;
        uVar27 = top_blob->w;
        local_40 = top_blob->data;
        local_48 = (long)(int)uVar27 * top_blob->elemsize;
        iVar49 = iVar43 * local_108.elempack;
        local_50 = (this->weight_data_tm).data;
        local_58 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
        bVar58 = local_108.elempack == 1;
        local_a8 = CONCAT44(local_a8._4_4_,iVar50) & 0xfffffffffffffffc;
        local_60 = (long)(int)(uVar44 * 4);
        local_68 = lVar40 * 4;
        local_b0 = 0;
        local_38 = local_70;
        do {
          if (0 < (int)uVar27) {
            lVar29 = local_60 + local_b0 * 2;
            pfVar52 = (float *)((local_60 + local_b0 * 2 + 1) * local_48 + (long)local_40);
            puVar48 = (undefined4 *)(lVar29 * local_48 + (long)local_40);
            uVar46 = (uint)lVar29;
            uVar25 = uVar46 + 3;
            if (-1 < (int)uVar46) {
              uVar25 = uVar46;
            }
            local_88._0_8_ = lVar29;
            pfVar32 = (float *)((((int)(uVar46 - (uVar25 & 0xfffffffc)) >> 1) + ((int)uVar25 >> 2))
                                * local_58 + (long)local_50);
            lVar29 = (long)local_108.w *
                     CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
            pfVar37 = (float *)(this->super_Convolution1D).activation_params.data;
            local_160 = local_68 + (long)local_108.data;
            iVar26 = 0;
            local_a0 = local_108.data;
            local_1a8 = local_108.data;
            local_1e0 = 0;
            do {
              fVar61 = 0.0;
              fVar62 = 0.0;
              fVar63 = 0.0;
              fVar64 = 0.0;
              uVar77 = 0;
              if (pvVar10 != (void *)0x0) {
                uVar77 = *(undefined8 *)((long)pvVar10 + local_88._0_8_ * 4);
              }
              uVar31 = 0;
              fVar94 = 0.0;
              fVar95 = 0.0;
              fVar96 = 0.0;
              fVar97 = 0.0;
              pfVar33 = pfVar32;
              if (3 < iVar50) {
                iVar45 = 0;
                do {
                  lVar47 = (iVar45 / iVar7) * lVar29;
                  pfVar38 = (float *)((long)local_a0 + lVar47 + (long)(iVar49 * (int)local_1e0) * 4)
                  ;
                  if ((iVar7 == 4) && (0 < iVar8)) {
                    pfVar38 = (float *)((long)local_a0 + lVar47 + (long)iVar26 * 4);
                    iVar42 = iVar8;
                    do {
                      fVar61 = fVar61 + *pfVar33 * *pfVar38;
                      fVar62 = fVar62 + pfVar33[1] * pfVar38[1];
                      fVar63 = fVar63 + pfVar33[2] * pfVar38[2];
                      fVar64 = fVar64 + pfVar33[3] * pfVar38[3];
                      fVar94 = fVar94 + *pfVar38 * pfVar33[4];
                      fVar95 = fVar95 + pfVar38[1] * pfVar33[5];
                      fVar96 = fVar96 + pfVar38[2] * pfVar33[6];
                      fVar97 = fVar97 + pfVar38[3] * pfVar33[7];
                      pfVar33 = pfVar33 + 8;
                      pfVar38 = pfVar38 + iVar9 * 4;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  iVar42 = iVar8;
                  if (0 < iVar8 && bVar58) {
                    do {
                      fVar61 = fVar61 + *pfVar33 * *pfVar38;
                      fVar62 = fVar62 + pfVar33[1] * pfVar38[lVar40];
                      fVar63 = fVar63 + pfVar33[2] * pfVar38[iVar24 * 2];
                      fVar64 = fVar64 + pfVar33[3] * pfVar38[iVar24 * 3];
                      fVar94 = fVar94 + *pfVar38 * pfVar33[4];
                      fVar95 = fVar95 + pfVar38[lVar40] * pfVar33[5];
                      fVar96 = fVar96 + pfVar38[iVar24 * 2] * pfVar33[6];
                      fVar97 = fVar97 + pfVar38[iVar24 * 3] * pfVar33[7];
                      pfVar33 = pfVar33 + 8;
                      pfVar38 = pfVar38 + lVar51;
                      iVar42 = iVar42 + -1;
                    } while (iVar42 != 0);
                  }
                  iVar42 = iVar45 + 7;
                  iVar45 = iVar45 + 4;
                } while (iVar42 < iVar50);
                uVar31 = local_a8 & 0xffffffff;
              }
              auVar79._0_4_ = (float)uVar77 + fVar63 + fVar61 + fVar64 + fVar62;
              auVar79._4_4_ = (float)((ulong)uVar77 >> 0x20) + fVar96 + fVar94 + fVar97 + fVar95;
              auVar79._8_4_ = fVar64 + fVar62 + 0.0 + fVar63 + fVar63;
              auVar79._12_4_ = fVar97 + fVar95 + 0.0 + fVar64 + fVar64;
              uVar46 = (uint)uVar31;
              if ((int)(uVar46 | 1) < iVar50) {
                lVar47 = local_160 + lVar29 * uVar31;
                pvVar34 = (void *)(lVar29 * uVar31 + (long)local_1a8);
                do {
                  if (0 < iVar8) {
                    lVar30 = 0;
                    iVar45 = iVar8;
                    do {
                      fVar61 = *(float *)((long)pvVar34 + lVar30);
                      fVar63 = auVar79._4_4_;
                      fVar64 = auVar79._8_4_;
                      fVar94 = auVar79._12_4_;
                      fVar62 = *(float *)(lVar47 + lVar30);
                      auVar79._0_4_ =
                           fVar62 * pfVar33[2] +
                           (float)*(undefined8 *)pfVar33 * fVar61 + auVar79._0_4_;
                      auVar79._4_4_ =
                           fVar62 * pfVar33[3] +
                           (float)((ulong)*(undefined8 *)pfVar33 >> 0x20) * fVar61 + fVar63;
                      auVar79._8_4_ = fVar62 * 0.0 + fVar61 * 0.0 + fVar64;
                      auVar79._12_4_ = fVar62 * 0.0 + fVar61 * 0.0 + fVar94;
                      pfVar33 = pfVar33 + 4;
                      lVar30 = lVar30 + lVar51 * 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  uVar31 = uVar31 + 2;
                  uVar46 = (uint)uVar31;
                  lVar47 = lVar47 + lVar29 * 2;
                  pvVar34 = (void *)((long)pvVar34 + lVar29 * 2);
                } while ((int)(uVar46 | 1) < iVar50);
              }
              if ((int)uVar46 < iVar50) {
                uVar31 = (ulong)uVar46;
                pfVar38 = (float *)(lVar29 * uVar31 + (long)local_1a8);
                do {
                  pfVar39 = pfVar38;
                  auVar73 = auVar79;
                  iVar45 = iVar8;
                  if (0 < iVar8) {
                    do {
                      fVar61 = *pfVar39;
                      auVar79._0_4_ = auVar73._0_4_ + fVar61 * *pfVar33;
                      auVar79._4_4_ = auVar73._4_4_ + fVar61 * pfVar33[1];
                      auVar79._8_4_ = auVar73._8_4_ + fVar61 * 0.0;
                      auVar79._12_4_ = auVar73._12_4_ + fVar61 * 0.0;
                      pfVar33 = pfVar33 + 2;
                      pfVar39 = pfVar39 + lVar51;
                      iVar45 = iVar45 + -1;
                      auVar73 = auVar79;
                    } while (iVar45 != 0);
                  }
                  uVar31 = uVar31 + 1;
                  pfVar38 = (float *)((long)pfVar38 + lVar29);
                } while ((int)uVar31 < iVar50);
              }
              iVar45 = (int)local_90 + -1;
              fVar61 = auVar79._0_4_;
              auVar73 = auVar79;
              switch(iVar45) {
              case 0:
                if (fVar61 <= 0.0) {
                  auVar17._12_4_ = 0;
                  auVar17._0_12_ = auVar79._4_12_;
                  auVar73 = auVar17 << 0x20;
                }
                break;
              case 1:
                auVar74 = ZEXT416(~-(uint)(0.0 < fVar61) & (uint)*pfVar37 |
                                  -(uint)(0.0 < fVar61) & 0x3f800000);
                goto LAB_00563650;
              case 2:
                fVar62 = pfVar37[1];
                fVar63 = *pfVar37;
                if (*pfVar37 <= fVar61) {
                  fVar63 = fVar61;
                }
                auVar73 = ZEXT416((uint)fVar63);
                if (fVar62 < fVar63) {
LAB_0056369e:
                  auVar73 = ZEXT416((uint)fVar62);
                }
                break;
              case 3:
                auVar59 = auVar79;
                if (88.37626 <= fVar61) {
                  auVar59._4_12_ = auVar79._4_12_;
                  auVar59._0_4_ = 0x42b0c0a5;
                }
                uVar46 = -(uint)(auVar59._0_4_ < -88.37626);
                fVar61 = expf((float)(uVar46 & 0x42b0c0a5 | ~uVar46 & (uint)-auVar59._0_4_));
                auVar73 = ZEXT416((uint)(1.0 / (fVar61 + 1.0)));
                break;
              case 4:
                fVar62 = expf(fVar61);
                fVar62 = logf(fVar62 + 1.0);
                fVar62 = tanhf(fVar62);
                auVar74._4_4_ = extraout_var._0_4_;
                auVar74._0_4_ = fVar62;
                auVar74._8_4_ = extraout_var._4_4_;
                auVar74._12_4_ = extraout_var._8_4_;
LAB_00563650:
                auVar73._4_12_ = auVar74._4_12_;
                auVar73._0_4_ = auVar74._0_4_ * fVar61;
                break;
              case 5:
                fVar62 = *pfVar37;
                fVar63 = -pfVar37[1] / fVar62;
                auVar73 = ZEXT816(0);
                if ((fVar63 <= fVar61) && (auVar73 = auVar79, fVar61 <= fVar63 + 1.0 / fVar62)) {
                  fVar62 = (fVar62 * fVar61 + pfVar37[1]) * fVar61;
                  goto LAB_0056369e;
                }
              }
              auVar78._4_4_ = auVar79._4_4_;
              auVar78._0_4_ = auVar78._4_4_;
              auVar78._8_4_ = auVar78._4_4_;
              auVar80._12_4_ = auVar78._4_4_;
              auVar80._0_12_ = auVar78;
              auVar81._4_12_ = auVar80._4_12_;
              switch(iVar45) {
              case 0:
                if (auVar78._4_4_ <= 0.0) {
                  auVar18._12_4_ = 0;
                  auVar18._0_12_ = auVar81._4_12_;
                  auVar80 = auVar18 << 0x20;
                }
              default:
                fVar61 = auVar80._0_4_;
                break;
              case 1:
                fVar61 = (float)(~-(uint)(0.0 < auVar78._4_4_) & (uint)*pfVar37 |
                                -(uint)(0.0 < auVar78._4_4_) & 0x3f800000) * auVar78._4_4_;
                break;
              case 2:
                fVar61 = pfVar37[1];
                fVar62 = *pfVar37;
                if (*pfVar37 <= auVar78._4_4_) {
                  fVar62 = auVar78._4_4_;
                }
                if (fVar62 <= fVar61) {
                  fVar61 = fVar62;
                }
                break;
              case 3:
                if (88.37626 <= auVar78._4_4_) {
                  auVar81._0_4_ = 0x42b0c0a5;
                  auVar78 = auVar81._0_12_;
                }
                uVar46 = -(uint)(auVar78._0_4_ < -88.37626);
                fVar61 = expf((float)(uVar46 & 0x42b0c0a5 | ~uVar46 & (uint)-auVar78._0_4_));
                fVar61 = 1.0 / (fVar61 + 1.0);
                break;
              case 4:
                fVar61 = expf(auVar78._4_4_);
                fVar61 = logf(fVar61 + 1.0);
                fVar61 = tanhf(fVar61);
                fVar61 = fVar61 * auVar78._4_4_;
                break;
              case 5:
                fVar62 = *pfVar37;
                fVar63 = -pfVar37[1] / fVar62;
                fVar61 = 0.0;
                if ((fVar63 <= auVar78._4_4_) &&
                   (fVar61 = auVar78._4_4_, auVar78._4_4_ <= fVar63 + 1.0 / fVar62)) {
                  fVar61 = (fVar62 * auVar78._4_4_ + pfVar37[1]) * auVar78._4_4_;
                }
              }
              *puVar48 = auVar73._0_4_;
              *pfVar52 = fVar61;
              puVar48 = puVar48 + 1;
              pfVar52 = pfVar52 + 1;
              local_1e0 = local_1e0 + 1;
              iVar26 = iVar26 + iVar49;
              local_160 = local_160 + lVar28 * 4;
              local_1a8 = (void *)((long)local_1a8 + lVar28 * 4);
            } while (local_1e0 != uVar27);
          }
          local_b0 = local_b0 + 1;
        } while (local_b0 != local_38);
      }
      iVar49 = uVar44 * 4 + (int)local_70 * 2;
      if (iVar49 < (int)local_b8) {
        pvVar34 = top_blob->data;
        iVar50 = top_blob->w;
        sVar11 = top_blob->elemsize;
        pvVar12 = (this->weight_data_tm).data;
        local_a0 = (void *)((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep);
        local_1b0 = (ulong)iVar49;
        local_a8 = lVar40 * 4;
        do {
          pvVar21 = local_108.data;
          if (0 < (int)local_98) {
            puVar48 = (undefined4 *)((long)iVar50 * sVar11 * local_1b0 + (long)pvVar34);
            uVar27 = (uint)local_1b0;
            uVar44 = uVar27 + 3;
            if (-1 < (int)uVar27) {
              uVar44 = uVar27;
            }
            pfVar37 = (float *)((long)(int)((uVar27 - (((uint)(local_1b0 >> 0x1f) & 1) + uVar27 &
                                                      0xfffffffe)) + ((int)uVar44 >> 2) +
                                           (int)(uVar27 - (uVar44 & 0xfffffffc)) / 2) *
                                (long)local_a0 + (long)pvVar12);
            lVar29 = (long)local_108.w *
                     CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
            pfVar52 = (float *)(this->super_Convolution1D).activation_params.data;
            local_1a8 = (void *)(local_a8 + (long)local_108.data);
            iVar49 = 0;
            local_1b8 = local_108.data;
            local_1d8 = 0;
            do {
              if (pvVar10 == (void *)0x0) {
                fVar61 = 0.0;
              }
              else {
                fVar61 = *(float *)((long)pvVar10 + local_1b0 * 4);
              }
              pfVar32 = pfVar37;
              if ((int)uVar23 < 4) {
                uVar31 = 0;
                fVar62 = 0.0;
                fVar63 = 0.0;
                fVar64 = 0.0;
                fVar94 = 0.0;
              }
              else {
                fVar62 = 0.0;
                fVar63 = 0.0;
                fVar64 = 0.0;
                fVar94 = 0.0;
                iVar26 = 0;
                do {
                  lVar47 = (iVar26 / iVar7) * lVar29;
                  if (iVar7 == 4 && 0 < iVar8) {
                    pfVar33 = (float *)((long)pvVar21 + lVar47 + (long)iVar49 * 4);
                    iVar45 = iVar8;
                    do {
                      fVar62 = fVar62 + *pfVar32 * *pfVar33;
                      fVar63 = fVar63 + pfVar32[1] * pfVar33[1];
                      fVar64 = fVar64 + pfVar32[2] * pfVar33[2];
                      fVar94 = fVar94 + pfVar32[3] * pfVar33[3];
                      pfVar32 = pfVar32 + 4;
                      pfVar33 = pfVar33 + iVar9 * 4;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  else {
                    pfVar33 = (float *)((long)pvVar21 +
                                       lVar47 + (long)(iVar7 * iVar43 * (int)local_1d8) * 4);
                  }
                  iVar45 = iVar8;
                  if (iVar7 == 1 && 0 < iVar8) {
                    do {
                      fVar62 = fVar62 + *pfVar33 * *pfVar32;
                      fVar63 = fVar63 + pfVar33[lVar40] * pfVar32[1];
                      fVar64 = fVar64 + pfVar33[iVar24 * 2] * pfVar32[2];
                      fVar94 = fVar94 + pfVar33[iVar24 * 3] * pfVar32[3];
                      pfVar32 = pfVar32 + 4;
                      pfVar33 = pfVar33 + lVar51;
                      iVar45 = iVar45 + -1;
                    } while (iVar45 != 0);
                  }
                  iVar45 = iVar26 + 7;
                  iVar26 = iVar26 + 4;
                } while (iVar45 < (int)uVar23);
                uVar31 = (ulong)uVar23 & 0xfffffffc;
              }
              auVar71._4_4_ = fVar94 + fVar63;
              auVar71._0_4_ = auVar71._4_4_;
              auVar71._8_4_ = auVar71._4_4_;
              auVar71._12_4_ = auVar71._4_4_;
              auVar72._4_12_ = auVar71._4_12_;
              auVar72._0_4_ = auVar71._4_4_ + fVar61 + fVar64 + fVar62;
              uVar27 = (uint)uVar31;
              if ((int)(uVar27 | 1) < (int)uVar23) {
                lVar47 = (long)local_1a8 + lVar29 * uVar31;
                pvVar35 = (void *)(lVar29 * uVar31 + (long)local_1b8);
                do {
                  auVar76 = auVar72;
                  if (0 < iVar8) {
                    lVar30 = 0;
                    iVar26 = iVar8;
                    do {
                      auVar75._4_4_ =
                           *(float *)(lVar47 + lVar30) *
                           (float)((ulong)*(undefined8 *)pfVar32 >> 0x20);
                      auVar75._0_4_ = auVar75._4_4_;
                      auVar75._8_4_ = auVar75._4_4_;
                      auVar75._12_4_ = auVar75._4_4_;
                      auVar76._4_12_ = auVar75._4_12_;
                      auVar76._0_4_ =
                           auVar75._4_4_ +
                           auVar72._0_4_ +
                           *(float *)((long)pvVar35 + lVar30) * (float)*(undefined8 *)pfVar32;
                      pfVar32 = pfVar32 + 2;
                      lVar30 = lVar30 + lVar51 * 4;
                      auVar72._4_4_ = auVar75._4_4_;
                      auVar72._0_4_ = auVar76._0_4_;
                      auVar72._8_4_ = auVar75._4_4_;
                      auVar72._12_4_ = auVar75._4_4_;
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  auVar72 = auVar76;
                  uVar31 = uVar31 + 2;
                  uVar27 = (uint)uVar31;
                  lVar47 = lVar47 + lVar29 * 2;
                  pvVar35 = (void *)((long)pvVar35 + lVar29 * 2);
                } while ((int)(uVar27 | 1) < (int)uVar23);
              }
              else {
                auVar72._4_4_ = auVar71._4_4_;
                auVar72._8_4_ = auVar71._4_4_;
                auVar72._12_4_ = auVar71._4_4_;
              }
              if ((int)uVar27 < (int)uVar23) {
                uVar31 = (ulong)uVar27;
                pfVar33 = (float *)(lVar29 * uVar31 + (long)local_1b8);
                do {
                  pfVar38 = pfVar33;
                  iVar26 = iVar8;
                  if (0 < iVar8) {
                    do {
                      auVar72._0_4_ = auVar72._0_4_ + *pfVar32 * *pfVar38;
                      pfVar32 = pfVar32 + 1;
                      pfVar38 = pfVar38 + lVar51;
                      iVar26 = iVar26 + -1;
                    } while (iVar26 != 0);
                  }
                  uVar31 = uVar31 + 1;
                  pfVar33 = (float *)((long)pfVar33 + lVar29);
                } while ((int)uVar31 < (int)uVar23);
              }
              fVar61 = auVar72._0_4_;
              auVar60 = auVar72;
              switch((int)local_90) {
              case 1:
                if (fVar61 <= 0.0) {
                  auVar19._12_4_ = 0;
                  auVar19._0_12_ = auVar72._4_12_;
                  auVar60 = auVar19 << 0x20;
                }
                break;
              case 2:
                auVar60 = ZEXT416((uint)((float)(~-(uint)(0.0 < fVar61) & (uint)*pfVar52 |
                                                -(uint)(0.0 < fVar61) & 0x3f800000) * fVar61));
                break;
              case 3:
                if (fVar61 <= *pfVar52) {
                  auVar72._0_4_ = *pfVar52;
                }
                fVar61 = pfVar52[1];
                auVar60 = auVar72;
                if (fVar61 < auVar72._0_4_) {
LAB_00563df5:
                  auVar60 = ZEXT416((uint)fVar61);
                }
                break;
              case 4:
                if (88.37626 <= fVar61) {
                  fVar61 = 88.37626;
                }
                fVar61 = expf((float)(-(uint)(fVar61 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar61 < -88.37626) & (uint)-fVar61));
                auVar60 = ZEXT416((uint)(1.0 / (fVar61 + 1.0)));
                break;
              case 5:
                local_88 = auVar72;
                fVar61 = expf(fVar61);
                fVar61 = logf(fVar61 + 1.0);
                fVar61 = tanhf(fVar61);
                auVar60._0_4_ = fVar61 * (float)local_88._0_4_;
                auVar60._4_12_ = extraout_var_00;
                break;
              case 6:
                fVar62 = *pfVar52;
                fVar63 = -pfVar52[1] / fVar62;
                auVar60 = ZEXT816(0);
                if ((fVar63 <= fVar61) && (auVar60 = auVar72, fVar61 <= fVar63 + 1.0 / fVar62)) {
                  fVar61 = (fVar62 * fVar61 + pfVar52[1]) * fVar61;
                  goto LAB_00563df5;
                }
              }
              *puVar48 = auVar60._0_4_;
              puVar48 = puVar48 + 1;
              local_1d8 = local_1d8 + 1;
              iVar49 = iVar49 + iVar43 * iVar7;
              local_1a8 = (void *)((long)local_1a8 + lVar28 * 4);
              local_1b8 = (void *)((long)local_1b8 + lVar28 * 4);
            } while (local_1d8 != local_98);
          }
          local_1b0 = local_1b0 + 1;
        } while (local_1b0 != local_b8);
      }
      iVar43 = 0;
    }
  }
  piVar20 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar20 != (int *)0x0) {
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (**(code **)(*(long *)local_108.allocator + 0x18))();
      }
    }
  }
  return iVar43;
}

Assistant:

int Convolution1D_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}